

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

QFontDialog * __thiscall QFontDialog::getFont(QFontDialog *this,bool *ok,QWidget *parent)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&local_48);
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  QFontDialogPrivate::getFont
            ((QFontDialogPrivate *)this,ok,(QFont *)&local_48,parent,(QString *)&local_68,
             (FontDialogOptions)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QFont::~QFont((QFont *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFont QFontDialog::getFont(bool *ok, QWidget *parent)
{
    QFont initial;
    return QFontDialogPrivate::getFont(ok, initial, parent, QString(), { });
}